

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetDepthClamp(GLContextState *this,bool bEnableDepthClamp)

{
  undefined *puVar1;
  bool bVar2;
  Char *pCVar3;
  undefined8 uVar4;
  undefined1 local_90 [8];
  string msg_1;
  undefined1 local_68 [4];
  GLenum err_1;
  string _msg;
  undefined1 local_38 [8];
  string msg;
  GLenum err;
  bool bEnableDepthClamp_local;
  GLContextState *this_local;
  
  msg.field_2._M_local_buf[0xf] = bEnableDepthClamp;
  bVar2 = EnableStateHelper::operator!=(&(this->m_RSState).DepthClampEnable,bEnableDepthClamp);
  if (bVar2) {
    if ((msg.field_2._M_local_buf[0xf] & 1U) == 0) {
      if (((this->m_Caps).IsDepthClampSupported & 1U) != 0) {
        glDisable();
        msg_1.field_2._12_4_ = glGetError();
        if (msg_1.field_2._12_4_ != 0) {
          LogError<false,char[30],char[17],unsigned_int>
                    (false,"SetDepthClamp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                     ,0x2b0,(char (*) [30])"Failed to disable depth clamp",
                     (char (*) [17])"\nGL Error Code: ",(uint *)(msg_1.field_2._M_local_buf + 0xc));
          FormatString<char[6]>((string *)local_90,(char (*) [6])0x4585f6);
          pCVar3 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar3,"SetDepthClamp",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                     ,0x2b0);
          std::__cxx11::string::~string((string *)local_90);
        }
      }
    }
    else if (((this->m_Caps).IsDepthClampSupported & 1U) == 0) {
      FormatString<char[95]>
                ((string *)local_68,
                 (char (*) [95])
                 "Depth clamp is not supported by this device. Check the value of the DepthClamp device feature."
                );
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar4 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar4,0);
      }
      std::__cxx11::string::~string((string *)local_68);
    }
    else {
      glEnable();
      msg.field_2._8_4_ = glGetError();
      if (msg.field_2._8_4_ != 0) {
        LogError<false,char[29],char[17],unsigned_int>
                  (false,"SetDepthClamp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x2a4,(char (*) [29])"Failed to enable depth clamp",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
        FormatString<char[6]>((string *)local_38,(char (*) [6])0x4585f6);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"SetDepthClamp",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x2a4);
        std::__cxx11::string::~string((string *)local_38);
      }
    }
    EnableStateHelper::operator=
              (&(this->m_RSState).DepthClampEnable,(bool)(msg.field_2._M_local_buf[0xf] & 1));
  }
  return;
}

Assistant:

void GLContextState::SetDepthClamp(bool bEnableDepthClamp)
{
    if (m_RSState.DepthClampEnable != bEnableDepthClamp)
    {
        if (bEnableDepthClamp)
        {
            // Note that enabling depth clamping in GL is the same as
            // disabling clipping in Direct3D.
            // https://docs.microsoft.com/en-us/windows/win32/api/d3d11/ns-d3d11-d3d11_rasterizer_desc
            // https://www.khronos.org/opengl/wiki/GLAPI/glEnable
            if (m_Caps.IsDepthClampSupported)
            {
                glEnable(GL_DEPTH_CLAMP);
                DEV_CHECK_GL_ERROR("Failed to enable depth clamp");
            }
            else
            {
                LOG_WARNING_MESSAGE("Depth clamp is not supported by this device. Check the value of the DepthClamp device feature.");
            }
        }
        else
        {
            if (m_Caps.IsDepthClampSupported)
            {
                glDisable(GL_DEPTH_CLAMP);
                DEV_CHECK_GL_ERROR("Failed to disable depth clamp");
            }
        }
        m_RSState.DepthClampEnable = bEnableDepthClamp;
    }
}